

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawFlags flags)

{
  uint in_ECX;
  float *in_RDX;
  float *in_RSI;
  float in_XMM0_Da;
  float rounding_bl;
  float rounding_br;
  float rounding_tr;
  float rounding_tl;
  ImVec2 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float local_98;
  float a_max_of_12;
  int in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined3 uVar1;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float local_78;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  uint local_20;
  float local_1c;
  float *local_18;
  float *local_10;
  
  local_20 = in_ECX;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (0.5 <= in_XMM0_Da) {
    local_20 = FixRectCornerFlags(in_ECX);
    in_stack_ffffffffffffff84 = 0x3f800000;
    local_78 = 0.5;
    if ((local_20 & 0x30) != 0x30 && (local_20 & 0xc0) != 0xc0) {
      local_78 = 1.0;
    }
    in_stack_ffffffffffffff78 = ImMin<float>(local_1c,ABS(*local_18 - *local_10) * local_78 + -1.0);
    in_stack_ffffffffffffff7c = ABS(local_18[1] - local_10[1]);
    uVar1 = (undefined3)in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff80 = CONCAT13(1,uVar1);
    if ((local_20 & 0x50) != 0x50) {
      in_stack_ffffffffffffff80 = CONCAT13((local_20 & 0xa0) == 0xa0,uVar1);
    }
    in_stack_ffffffffffffff70 = 0x3f800000;
    in_stack_ffffffffffffff74 = 0.5;
    if ((char)((uint)in_stack_ffffffffffffff80 >> 0x18) == '\0') {
      in_stack_ffffffffffffff74 = 1.0;
    }
    local_1c = in_stack_ffffffffffffff78;
    local_1c = ImMin<float>(in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff7c * in_stack_ffffffffffffff74 + -1.0);
  }
  if ((local_1c < 0.5) || ((local_20 & 0x1f0) == 0x100)) {
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    ImVec2::ImVec2(&local_28,*local_18,local_10[1]);
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    ImVec2::ImVec2(&local_30,*local_10,local_18[1]);
    PathLineTo((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
  }
  else {
    a_max_of_12 = local_1c;
    if ((local_20 & 0x10) == 0) {
      a_max_of_12 = 0.0;
    }
    if ((local_20 & 0x20) == 0) {
      local_98 = 0.0;
    }
    else {
      local_98 = local_1c;
    }
    local_38 = local_98;
    local_3c = local_1c;
    if ((local_20 & 0x80) == 0) {
      local_3c = 0.0;
    }
    local_40 = local_1c;
    if ((local_20 & 0x40) == 0) {
      local_40 = 0.0;
    }
    local_34 = a_max_of_12;
    ImVec2::ImVec2(&local_48,*local_10 + a_max_of_12,local_10[1] + a_max_of_12);
    PathArcToFast((ImDrawList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                  in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)a_max_of_12);
    ImVec2::ImVec2(&local_50,*local_18 - local_38,local_10[1] + local_38);
    PathArcToFast((ImDrawList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                  in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)a_max_of_12);
    ImVec2::ImVec2(&local_58,*local_18 - local_3c,local_18[1] - local_3c);
    PathArcToFast((ImDrawList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                  in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)a_max_of_12);
    ImVec2::ImVec2(&local_60,*local_10 + local_40,local_18[1] - local_40);
    PathArcToFast((ImDrawList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                  in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)a_max_of_12);
  }
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawFlags flags)
{
    if (rounding >= 0.5f)
    {
        flags = FixRectCornerFlags(flags);
        rounding = ImMin(rounding, ImFabs(b.x - a.x) * (((flags & ImDrawFlags_RoundCornersTop) == ImDrawFlags_RoundCornersTop) || ((flags & ImDrawFlags_RoundCornersBottom) == ImDrawFlags_RoundCornersBottom) ? 0.5f : 1.0f) - 1.0f);
        rounding = ImMin(rounding, ImFabs(b.y - a.y) * (((flags & ImDrawFlags_RoundCornersLeft) == ImDrawFlags_RoundCornersLeft) || ((flags & ImDrawFlags_RoundCornersRight) == ImDrawFlags_RoundCornersRight) ? 0.5f : 1.0f) - 1.0f);
    }
    if (rounding < 0.5f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (flags & ImDrawFlags_RoundCornersTopLeft)     ? rounding : 0.0f;
        const float rounding_tr = (flags & ImDrawFlags_RoundCornersTopRight)    ? rounding : 0.0f;
        const float rounding_br = (flags & ImDrawFlags_RoundCornersBottomRight) ? rounding : 0.0f;
        const float rounding_bl = (flags & ImDrawFlags_RoundCornersBottomLeft)  ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}